

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdp.cpp
# Opt level: O0

void __thiscall despot::MDP::ComputeBlindAlpha(MDP *this)

{
  value_type vVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  reference pvVar5;
  undefined4 extraout_var;
  size_type sVar6;
  const_reference pvVar7;
  log_ostream *plVar8;
  ostream *poVar9;
  void *this_00;
  reference this_01;
  vector<double,_std::allocator<double>_> *this_02;
  double extraout_XMM0_Qa;
  double dVar10;
  double extraout_XMM0_Qa_00;
  double dVar11;
  double extraout_XMM0_Qa_01;
  State *next;
  int i;
  vector<despot::State,_std::allocator<despot::State>_> *transition;
  int local_a0;
  int s_3;
  int s_2;
  int iter;
  double tol;
  int s_1;
  double reward;
  double dStack_78;
  int s;
  double min;
  undefined1 local_68 [8];
  vector<double,_std::allocator<double>_> prev;
  allocator<double> local_39;
  undefined1 local_38 [8];
  vector<double,_std::allocator<double>_> cur;
  ACT_TYPE action;
  int num_actions;
  int num_states;
  MDP *this_local;
  
  iVar2 = (*this->_vptr_MDP[2])();
  iVar3 = (*this->_vptr_MDP[3])();
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(&this->blind_alpha_,(long)iVar3);
  cur.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  do {
    if (iVar3 <= (int)cur.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_) {
      return;
    }
    std::allocator<double>::allocator(&local_39);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_38,(long)iVar2,&local_39);
    std::allocator<double>::~allocator(&local_39);
    std::allocator<double>::allocator((allocator<double> *)((long)&min + 7));
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_68,(long)iVar2,
               (allocator<double> *)((long)&min + 7));
    std::allocator<double>::~allocator((allocator<double> *)((long)&min + 7));
    dStack_78 = INFINITY;
    for (reward._4_4_ = 0; (int)reward._4_4_ < iVar2; reward._4_4_ = reward._4_4_ + 1) {
      (*this->_vptr_MDP[5])
                (this,(ulong)reward._4_4_,
                 (ulong)cur.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_);
      if (extraout_XMM0_Qa < dStack_78) {
        dStack_78 = extraout_XMM0_Qa;
      }
    }
    for (tol._4_4_ = 0; tol._4_4_ < iVar2; tol._4_4_ = tol._4_4_ + 1) {
      dVar10 = Globals::Discount();
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_38,(long)tol._4_4_);
      *pvVar5 = dStack_78 / (1.0 - dVar10);
    }
    _s_2 = 0.0;
    for (s_3 = 0; s_3 < 1000; s_3 = s_3 + 1) {
      _s_2 = 0.0;
      for (local_a0 = 0; local_a0 < iVar2; local_a0 = local_a0 + 1) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_38,(long)local_a0);
        vVar1 = *pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_68,(long)local_a0);
        *pvVar5 = vVar1;
      }
      for (transition._4_4_ = 0; (int)transition._4_4_ < iVar2;
          transition._4_4_ = transition._4_4_ + 1) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_38,
                            (long)(int)transition._4_4_);
        *pvVar5 = 0.0;
        iVar4 = (*this->_vptr_MDP[4])
                          (this,(ulong)transition._4_4_,
                           (ulong)cur.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage._4_4_);
        for (next._4_4_ = 0;
            sVar6 = std::vector<despot::State,_std::allocator<despot::State>_>::size
                              ((vector<despot::State,_std::allocator<despot::State>_> *)
                               CONCAT44(extraout_var,iVar4)), (ulong)(long)next._4_4_ < sVar6;
            next._4_4_ = next._4_4_ + 1) {
          pvVar7 = std::vector<despot::State,_std::allocator<despot::State>_>::operator[]
                             ((vector<despot::State,_std::allocator<despot::State>_> *)
                              CONCAT44(extraout_var,iVar4),(long)next._4_4_);
          if (pvVar7->state_id < 0) {
            __assert_fail("next.state_id >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/core/mdp.cpp"
                          ,0x61,"virtual void despot::MDP::ComputeBlindAlpha()");
          }
          dVar10 = pvVar7->weight;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)local_68,
                              (long)pvVar7->state_id);
          dVar11 = *pvVar5;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)local_38,
                              (long)(int)transition._4_4_);
          *pvVar5 = dVar10 * dVar11 + *pvVar5;
        }
        (*this->_vptr_MDP[5])
                  (this,(ulong)transition._4_4_,
                   (ulong)cur.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._4_4_);
        dVar11 = Globals::Discount();
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_38,
                            (long)(int)transition._4_4_);
        dVar10 = *pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_38,
                            (long)(int)transition._4_4_);
        *pvVar5 = dVar11 * dVar10 + extraout_XMM0_Qa_00;
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)local_38,(long)(int)transition._4_4_);
        this_02 = (vector<double,_std::allocator<double>_> *)local_68;
        std::vector<double,_std::allocator<double>_>::operator[]
                  (this_02,(long)(int)transition._4_4_);
        std::abs((int)this_02);
        _s_2 = extraout_XMM0_Qa_01 + _s_2;
      }
      if (_s_2 < 0.0001) {
        s_3 = s_3 + 1;
        break;
      }
    }
    iVar4 = logging::level();
    if ((0 < iVar4) && (iVar4 = logging::level(), 2 < iVar4)) {
      plVar8 = logging::stream(3);
      poVar9 = std::operator<<(&plVar8->super_ostream,"[MDP::ComputeBlindAlpha] Tol(alpha_");
      poVar9 = (ostream *)
               std::ostream::operator<<
                         (poVar9,cur.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage._4_4_);
      poVar9 = std::operator<<(poVar9,") after ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,s_3);
      poVar9 = std::operator<<(poVar9," iters = ");
      this_00 = (void *)std::ostream::operator<<(poVar9,_s_2);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
    this_01 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[](&this->blind_alpha_,
                           (long)(int)cur.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    std::vector<double,_std::allocator<double>_>::operator=
              (this_01,(vector<double,_std::allocator<double>_> *)local_38);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_68);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_38);
    cur.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ =
         cur.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_ + 1;
  } while( true );
}

Assistant:

void MDP::ComputeBlindAlpha() {
	int num_states = NumStates(), num_actions = NumActions();

	blind_alpha_.resize(num_actions);

	for (ACT_TYPE action = 0; action < num_actions; action++) {
		vector<double> cur(num_states), prev(num_states);

		double min = Globals::POS_INFTY;
		for (int s = 0; s < num_states; s++) {
			double reward = Reward(s, action);
			if (reward < min)
				min = reward;
		}

		for (int s = 0; s < num_states; s++)
			cur[s] = min / (1 - Globals::Discount());

		double tol = 0;
		int iter = 0;
		for (iter = 0; iter < 1000; iter++) {
			tol = 0;

			for (int s = 0; s < num_states; s++)
				prev[s] = cur[s];

			for (int s = 0; s < num_states; s++) {
				cur[s] = 0;
				const vector<State>& transition = TransitionProbability(s,
					action);
				for (int i = 0; i < transition.size(); i++) {
					const State& next = transition[i];
					assert(next.state_id >= 0);
					cur[s] += next.weight * prev[next.state_id];
				}
				cur[s] = Reward(s, action) + Globals::Discount() * cur[s];

				tol += abs(cur[s] - prev[s]);
			}

			if (tol < 0.0001) {
				iter++;
				break;
			}
		}
		logi << "[MDP::ComputeBlindAlpha] Tol(alpha_" << action << ") after " << iter << " iters = "
			<< tol << endl;

		blind_alpha_[action] = cur;
	}
}